

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O0

void __thiscall
TPZSkylMatrix<double>::SolveSOR
          (TPZSkylMatrix<double> *this,int64_t *numiterations,TPZFMatrix<double> *F,
          TPZFMatrix<double> *result,TPZFMatrix<double> *residual,TPZFMatrix<double> *scratch,
          REAL overrelax,REAL *tol,int FromCurrent,int direction)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  undefined4 extraout_var;
  int64_t iVar6;
  int64_t iVar7;
  double **ppdVar8;
  double *pdVar9;
  double *pdVar10;
  double *pdVar11;
  long *in_RCX;
  TPZBaseMatrix *in_RDX;
  long *in_RSI;
  TPZFMatrix<double> *in_RDI;
  double **this_00;
  TPZBaseMatrix *in_R8;
  double in_XMM0_Qa;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double *in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  double val_3;
  double *scratchp_1;
  double *diaglast_3;
  double *diag_3;
  int64_t offset_3;
  double *diaglast_2;
  double *diag_2;
  double *p_1;
  double val_2;
  int64_t offset_2;
  double *diaglast_1;
  double *diag_1;
  double *p;
  double val_1;
  int64_t offset_1;
  int64_t id;
  int64_t lastid;
  double *scratchp;
  double *diaglast;
  double *diag;
  double val;
  int64_t offset;
  int64_t ic;
  int64_t it;
  int64_t iinc;
  int64_t ilast;
  int64_t ifirst;
  int64_t i;
  int64_t c;
  int64_t r;
  double over;
  REAL res;
  double in_stack_fffffffffffffea8;
  TPZFMatrix<double> *in_stack_fffffffffffffeb0;
  undefined7 in_stack_fffffffffffffeb8;
  undefined1 uVar12;
  double *local_130;
  double *local_120;
  double *local_108;
  double *local_100;
  double local_f8;
  double *local_e0;
  double *local_d8;
  double local_d0;
  long local_c0;
  long local_88;
  long local_80;
  long local_78;
  long local_70;
  long local_68;
  long local_60;
  double local_40;
  
  if (in_R8 == in_RDX) {
    std::operator<<((ostream *)&std::cout,
                    "TPZMatrix::SolveSOR called with residual and F equal, no solution\n");
  }
  else {
    local_40 = *in_stack_00000008 + *in_stack_00000008 + 1.0;
    local_f8 = in_stack_fffffffffffffea8;
    if (in_R8 != (TPZBaseMatrix *)0x0) {
      local_40 = ::Norm((TPZFMatrix<double> *)0x1373fca);
      local_f8 = in_stack_fffffffffffffea8;
    }
    if (in_stack_00000010 == 0) {
      (**(code **)(*in_RCX + 0x78))();
    }
    iVar5 = (*(in_RDI->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable[0xc])();
    local_70 = CONCAT44(extraout_var,iVar5);
    iVar6 = TPZBaseMatrix::Cols(in_RDX);
    local_68 = 0;
    local_78 = 1;
    if (in_stack_00000018 == -1) {
      local_68 = local_70 + -1;
      local_70 = 0;
      local_78 = -1;
    }
    local_80 = 0;
    while( true ) {
      uVar12 = false;
      if (local_80 < *in_RSI) {
        uVar12 = *in_stack_00000008 <= local_40 && local_40 != *in_stack_00000008;
      }
      if ((bool)uVar12 == false) break;
      local_40 = 0.0;
      TPZFMatrix<double>::operator=
                ((TPZFMatrix<double> *)CONCAT17(uVar12,in_stack_fffffffffffffeb8),
                 in_stack_fffffffffffffeb0);
      for (local_88 = 0; local_88 < iVar6; local_88 = local_88 + 1) {
        if (in_stack_00000018 == 1) {
          for (local_60 = local_68; local_60 != local_70; local_60 = local_78 + local_60) {
            iVar7 = Size((TPZSkylMatrix<double> *)in_stack_fffffffffffffeb0,(int64_t)local_f8);
            ppdVar8 = TPZVec<double_*>::operator[]((TPZVec<double_*> *)&in_RDI->fElem,local_60);
            pdVar11 = *ppdVar8;
            pdVar9 = TPZFMatrix<double>::operator()
                               (in_RDI,CONCAT17(uVar12,in_stack_fffffffffffffeb8),
                                (int64_t)in_stack_fffffffffffffeb0);
            pdVar10 = TPZFMatrix<double>::operator()
                                (in_RDI,CONCAT17(uVar12,in_stack_fffffffffffffeb8),
                                 (int64_t)in_stack_fffffffffffffeb0);
            dVar1 = *pdVar10;
            ppdVar8 = TPZVec<double_*>::operator[]((TPZVec<double_*> *)&in_RDI->fElem,local_60);
            pdVar10 = *ppdVar8;
            for (local_c0 = 0; local_c0 <= (long)pdVar10 + ((iVar7 * 8 + -8) - (long)pdVar11) >> 3;
                local_c0 = local_c0 + 1) {
              pdVar9[local_c0] = -pdVar10[iVar7 + (-1 - local_c0)] * dVar1 + pdVar9[local_c0];
            }
          }
          for (local_60 = local_68; local_60 != local_70; local_60 = local_78 + local_60) {
            iVar7 = Size((TPZSkylMatrix<double> *)in_stack_fffffffffffffeb0,(int64_t)local_f8);
            pdVar11 = TPZFMatrix<double>::operator()
                                (in_RDI,CONCAT17(uVar12,in_stack_fffffffffffffeb8),
                                 (int64_t)in_stack_fffffffffffffeb0);
            local_d0 = *pdVar11;
            local_d8 = TPZFMatrix<double>::operator()
                                 (in_RDI,CONCAT17(uVar12,in_stack_fffffffffffffeb8),
                                  (int64_t)in_stack_fffffffffffffeb0);
            ppdVar8 = TPZVec<double_*>::operator[]((TPZVec<double_*> *)&in_RDI->fElem,local_60);
            local_e0 = *ppdVar8 + iVar7;
            this_00 = &in_RDI->fElem;
            ppdVar8 = TPZVec<double_*>::operator[]((TPZVec<double_*> *)this_00,local_60);
            while (local_e0 = local_e0 + -1, *ppdVar8 < local_e0) {
              local_d0 = -*local_e0 * *local_d8 + local_d0;
              local_d8 = local_d8 + 1;
            }
            std::abs((int)this_00);
            local_40 = extraout_XMM0_Qa + local_40;
            in_stack_fffffffffffffeb0 = (TPZFMatrix<double> *)((local_d0 * in_XMM0_Qa) / *local_e0);
            pdVar11 = TPZFMatrix<double>::operator()
                                (in_RDI,CONCAT17(uVar12,in_stack_fffffffffffffeb8),
                                 (int64_t)in_stack_fffffffffffffeb0);
            *pdVar11 = (double)in_stack_fffffffffffffeb0 + *pdVar11;
          }
        }
        else {
          for (local_60 = local_68; local_60 != local_70; local_60 = local_78 + local_60) {
            iVar7 = Size((TPZSkylMatrix<double> *)in_stack_fffffffffffffeb0,(int64_t)local_f8);
            pdVar11 = TPZFMatrix<double>::operator()
                                (in_RDI,CONCAT17(uVar12,in_stack_fffffffffffffeb8),
                                 (int64_t)in_stack_fffffffffffffeb0);
            local_f8 = *pdVar11;
            local_100 = TPZFMatrix<double>::operator()
                                  (in_RDI,CONCAT17(uVar12,in_stack_fffffffffffffeb8),
                                   (int64_t)in_stack_fffffffffffffeb0);
            ppdVar8 = TPZVec<double_*>::operator[]((TPZVec<double_*> *)&in_RDI->fElem,local_60);
            local_108 = *ppdVar8 + iVar7;
            ppdVar8 = TPZVec<double_*>::operator[]((TPZVec<double_*> *)&in_RDI->fElem,local_60);
            while (local_108 = local_108 + -1, *ppdVar8 < local_108) {
              local_f8 = -*local_108 * *local_100 + local_f8;
              local_100 = local_100 + 1;
            }
            pdVar11 = TPZFMatrix<double>::operator()
                                (in_RDI,CONCAT17(uVar12,in_stack_fffffffffffffeb8),
                                 (int64_t)in_stack_fffffffffffffeb0);
            *pdVar11 = local_f8;
          }
          for (local_60 = local_68; local_60 != local_70; local_60 = local_78 + local_60) {
            iVar7 = Size((TPZSkylMatrix<double> *)in_stack_fffffffffffffeb0,(int64_t)local_f8);
            ppdVar8 = TPZVec<double_*>::operator[]((TPZVec<double_*> *)&in_RDI->fElem,local_60);
            pdVar11 = *ppdVar8;
            local_130 = TPZFMatrix<double>::operator()
                                  (in_RDI,CONCAT17(uVar12,in_stack_fffffffffffffeb8),
                                   (int64_t)in_stack_fffffffffffffeb0);
            pdVar10 = TPZFMatrix<double>::operator()
                                (in_RDI,CONCAT17(uVar12,in_stack_fffffffffffffeb8),
                                 (int64_t)in_stack_fffffffffffffeb0);
            dVar1 = *pdVar10;
            dVar2 = *pdVar11;
            iVar5 = (int)in_RCX;
            pdVar10 = TPZFMatrix<double>::operator()
                                (in_RDI,CONCAT17(uVar12,in_stack_fffffffffffffeb8),
                                 (int64_t)in_stack_fffffffffffffeb0);
            dVar3 = *pdVar10;
            std::abs(iVar5);
            local_40 = extraout_XMM0_Qa_00 + local_40;
            dVar4 = *pdVar11;
            pdVar10 = TPZFMatrix<double>::operator()
                                (in_RDI,CONCAT17(uVar12,in_stack_fffffffffffffeb8),
                                 (int64_t)in_stack_fffffffffffffeb0);
            *pdVar10 = (in_XMM0_Qa * (-dVar2 * dVar3 + dVar1)) / dVar4 + *pdVar10;
            pdVar10 = TPZFMatrix<double>::operator()
                                (in_RDI,CONCAT17(uVar12,in_stack_fffffffffffffeb8),
                                 (int64_t)in_stack_fffffffffffffeb0);
            dVar1 = *pdVar10;
            ppdVar8 = TPZVec<double_*>::operator[]((TPZVec<double_*> *)&in_RDI->fElem,local_60);
            local_120 = *ppdVar8 + iVar7;
            while (local_120 = local_120 + -1, pdVar11 < local_120) {
              *local_130 = -*local_120 * dVar1 + *local_130;
              local_130 = local_130 + 1;
            }
          }
        }
      }
      local_40 = sqrt(local_40);
      local_80 = local_80 + 1;
    }
    if (in_R8 != (TPZBaseMatrix *)0x0) {
      (*(in_RDI->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
        [0x28])(in_RDI,in_RCX,in_RDX,in_R8);
    }
    *in_RSI = local_80;
    *in_stack_00000008 = local_40;
  }
  return;
}

Assistant:

void TPZSkylMatrix<TVar>::SolveSOR(int64_t & numiterations,const TPZFMatrix<TVar> &F,
                                   TPZFMatrix<TVar> &result, TPZFMatrix<TVar> *residual, TPZFMatrix<TVar> &scratch,const REAL overrelax,
                                   REAL &tol,const int FromCurrent,const int direction)  {
	
	if(residual == &F) {
		cout << "TPZMatrix::SolveSOR called with residual and F equal, no solution\n";
		return;
	}
	REAL res = 2.*tol+1.;
	if(residual) res = Norm(*residual);
	if(!FromCurrent) {
		result.Zero();
	}
    TVar over = overrelax;
	int64_t r = this->Dim();
	int64_t c = F.Cols();
	int64_t i,ifirst = 0, ilast = r, iinc = 1;
	if(direction == -1) {
		ifirst = r-1;
		ilast = 0;
		iinc = -1;
	}
	int64_t it;
	for(it=0; it<numiterations && res > tol; it++) {
		res = 0.;
		scratch = F;
		for(int64_t ic=0; ic<c; ic++) {
			if(direction == 1) {
				//
				// compute the upper triangular part first and put into the scractch vector
				//
				for(i=ifirst; i!=ilast; i+= iinc) {
					//TPZColuna *mydiag = &fDiag[i];
					int64_t offset = Size(i);
					TVar val;
					TVar *diag;
					TVar *diaglast = fElem[i];
					TVar *scratchp = &scratch(i-offset+1,ic);
					val = result(i,ic);
					diag = fElem[i] + offset-1;
					int64_t lastid = diag-diaglast;
					int64_t id;
					for(id=0; id<=lastid; id++) *(scratchp+id) -= *(diag-id) * val;
					/* codeguard fix
					 while( diag >= diaglast ) *scratchp++ -= *diag-- * val;
					 */
				}
				//
				// perform the SOR operation
				//
				for(i=ifirst; i!=ilast; i+= iinc) {
					//TPZColuna *mydiag = &fDiag[i];
					int64_t offset = Size(i);
					TVar val = scratch(i,ic);
					TVar *p = &result(i-offset+1,ic);
					TVar *diag = fElem[i] + offset-1;
					TVar *diaglast = fElem[i];
					while( diag > diaglast ) val -= *diag-- * *p++;
					res += abs(val*val);
					result(i,ic) += val*over/ (*diag);
				}
			} else {
				//
				// the direction is upward
				//
				// put the lower triangular part of the multiplication into the scratch vector
				//
				for(i=ifirst; i!=ilast; i+= iinc) {
					//TPZColuna *mydiag = &fDiag[i];
					int64_t offset = Size(i);
					TVar val = scratch(i,ic);
					TVar *p = &result(i-offset+1,ic);
					TVar *diag = fElem[i] + offset-1;
					TVar *diaglast = fElem[i];
					while( diag > diaglast ) val -= *diag-- * *p++;
					//					res += val*val;
					scratch(i,ic) = val;
				}
				//
				// perform the SOR operation
				//
				for(i=ifirst; i!=ilast; i+= iinc) {
					//TPZColuna *mydiag = &fDiag[i];
					int64_t offset = Size(i);
					//	TVar val = scratch(i,ic);
					TVar *diag;
					TVar *diaglast = fElem[i];
					TVar *scratchp = &scratch(i-offset+1,ic);
					//val= result(i,ic);
					TVar val = scratch(i,ic);
					val -= *diaglast * result(i,ic);
					res += abs(val*val);
					val = over * val / *diaglast;
					result(i,ic) += val;
					val = result(i,ic);
					diag = fElem[i] + offset-1;
					while( diag > diaglast ) *scratchp++ -= *diag-- * val;
				}
			}
		}
		res = sqrt(res);
	}
	if(residual) {
		this->Residual(result,F,*residual);
	}
	numiterations = it;
	tol = res;
}